

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpString.c
# Opt level: O0

int UpnpString_set_StringN(UpnpString *p,char *s,size_t n)

{
  char *__s;
  size_t sVar1;
  char *q;
  size_t n_local;
  char *s_local;
  UpnpString *p_local;
  
  __s = strndup(s,n);
  if (__s != (char *)0x0) {
    free(*(void **)(p + 8));
    sVar1 = strlen(__s);
    *(size_t *)p = sVar1;
    *(char **)(p + 8) = __s;
  }
  return (int)(__s != (char *)0x0);
}

Assistant:

int UpnpString_set_StringN(UpnpString *p, const char *s, size_t n)
{
	char *q = strndup(s, n);
	if (!q)
		goto error_handler1;
	free(((struct SUpnpString *)p)->m_string);
	((struct SUpnpString *)p)->m_length = strlen(q);
	((struct SUpnpString *)p)->m_string = q;

error_handler1:
	return q != NULL;
}